

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

fdb_status sb_sync_circular(fdb_kvs_handle *handle)

{
  fdb_status fVar1;
  
  fVar1 = sb_write(handle->file,
                   (handle->file->sb->revnum).super___atomic_base<unsigned_long>._M_i %
                   (ulong)handle->file->sb->config->num_sb,&handle->log_callback);
  return fVar1;
}

Assistant:

fdb_status sb_sync_circular(fdb_kvs_handle *handle)
{
    uint64_t sb_revnum;
    fdb_status fs;

    sb_revnum = atomic_get_uint64_t(&handle->file->sb->revnum);
    fs = sb_write(handle->file,
                  sb_revnum % handle->file->sb->config->num_sb,
                  &handle->log_callback);
    return fs;
}